

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-metrics.c
# Opt level: O1

void fs_prepare_cb(uv_prepare_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  void *pvVar3;
  void *pvVar4;
  long *plVar5;
  int64_t eval_b;
  int64_t eval_a;
  uv_metrics_t metrics;
  long local_90;
  undefined1 local_88 [8];
  long local_80;
  long local_78;
  
  uVar2 = uv_default_loop();
  iVar1 = uv_metrics_info(uVar2,local_88);
  local_90 = (long)iVar1;
  if (local_90 == 0) {
    local_90 = 0;
    if (pool_events_counter == 1) {
      local_90 = local_80;
      if (local_80 != local_78) goto LAB_001ad915;
    }
    if (6 < pool_events_counter) {
      uv_prepare_stop(handle);
      pool_events_counter = -0x2a;
    }
    return;
  }
  fs_prepare_cb_cold_1();
LAB_001ad915:
  plVar5 = &local_90;
  fs_prepare_cb_cold_2();
  pvVar3 = malloc(0x80);
  pvVar4 = malloc(0x80);
  pool_events_counter = pool_events_counter + 1;
  uv_fs_req_cleanup(plVar5);
  uVar2 = uv_default_loop();
  iVar1 = uv_queue_work(uVar2,pvVar3,fs_work_cb,fs_after_work_cb);
  if (iVar1 == 0) {
    uVar2 = uv_default_loop();
    iVar1 = uv_queue_work(uVar2,pvVar4,fs_work_cb,fs_after_work_cb);
    if (iVar1 == 0) {
      return;
    }
  }
  else {
    fs_write_cb_cold_1();
  }
  fs_write_cb_cold_2();
  uv_fs_req_cleanup();
  pool_events_counter = pool_events_counter + 1;
  return;
}

Assistant:

static void fs_prepare_cb(uv_prepare_t* handle) {
  uv_metrics_t metrics;

  ASSERT_OK(uv_metrics_info(uv_default_loop(), &metrics));

  if (pool_events_counter == 1)
    ASSERT_EQ(metrics.events, metrics.events_waiting);

  if (pool_events_counter < 7)
    return;

  uv_prepare_stop(handle);
  pool_events_counter = -42;
}